

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_pcg.c
# Opt level: O2

SUNErrCode SUNLinSolFree_PCG(SUNLinearSolver S)

{
  void *__ptr;
  
  if (S != (SUNLinearSolver)0x0) {
    __ptr = S->content;
    if (__ptr != (void *)0x0) {
      if (*(long *)((long)__ptr + 0x50) != 0) {
        N_VDestroy(*(long *)((long)__ptr + 0x50));
        __ptr = S->content;
        *(undefined8 *)((long)__ptr + 0x50) = 0;
      }
      if (*(long *)((long)__ptr + 0x58) != 0) {
        N_VDestroy(*(long *)((long)__ptr + 0x58));
        __ptr = S->content;
        *(undefined8 *)((long)__ptr + 0x58) = 0;
      }
      if (*(long *)((long)__ptr + 0x60) != 0) {
        N_VDestroy(*(long *)((long)__ptr + 0x60));
        __ptr = S->content;
        *(undefined8 *)((long)__ptr + 0x60) = 0;
      }
      if (*(long *)((long)__ptr + 0x68) != 0) {
        N_VDestroy(*(long *)((long)__ptr + 0x68));
        __ptr = S->content;
        *(undefined8 *)((long)__ptr + 0x68) = 0;
      }
      free(__ptr);
      S->content = (void *)0x0;
    }
    free(S->ops);
    free(S);
  }
  return 0;
}

Assistant:

SUNErrCode SUNLinSolFree_PCG(SUNLinearSolver S)
{
  if (S == NULL) { return SUN_SUCCESS; }

  if (S->content)
  {
    /* delete items from within the content structure */
    if (PCG_CONTENT(S)->r)
    {
      N_VDestroy(PCG_CONTENT(S)->r);
      PCG_CONTENT(S)->r = NULL;
    }
    if (PCG_CONTENT(S)->p)
    {
      N_VDestroy(PCG_CONTENT(S)->p);
      PCG_CONTENT(S)->p = NULL;
    }
    if (PCG_CONTENT(S)->z)
    {
      N_VDestroy(PCG_CONTENT(S)->z);
      PCG_CONTENT(S)->z = NULL;
    }
    if (PCG_CONTENT(S)->Ap)
    {
      N_VDestroy(PCG_CONTENT(S)->Ap);
      PCG_CONTENT(S)->Ap = NULL;
    }
    free(S->content);
    S->content = NULL;
  }
  if (S->ops)
  {
    free(S->ops);
    S->ops = NULL;
  }
  free(S);
  S = NULL;
  return SUN_SUCCESS;
}